

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O0

void __thiscall jsonrpcpp::Request::Request(Request *this,Json *json)

{
  bool bVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40 [2];
  allocator<char> local_19;
  Json *local_18;
  Json *json_local;
  Request *this_local;
  
  local_18 = json;
  json_local = (Json *)this;
  Entity::Entity(&this->super_Entity,request);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Request_00207110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->method_,"",&local_19);
  std::allocator<char>::~allocator(&local_19);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(local_40,(nullptr_t)0x0);
  Parameter::Parameter(&this->params_,local_40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(local_40);
  Id::Id(&this->id_);
  bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(local_18,(void *)0x0);
  if (bVar1) {
    parse_json(this,local_18);
  }
  return;
}

Assistant:

inline Request::Request(const Json& json) : Entity(entity_t::request), method_(""), id_()
{
    if (json != nullptr)
        Request::parse_json(json);
}